

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

void ON_ExtrusionCopyHelper(ON_Extrusion *src,ON_Extrusion *dst)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  undefined4 extraout_var;
  ON_Curve *pOVar11;
  
  if (src != dst) {
    if (dst->m_profile != (ON_Curve *)0x0) {
      (*(dst->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      dst->m_profile = (ON_Curve *)0x0;
    }
    dVar8 = (src->m_path).from.x;
    dVar9 = (src->m_path).from.y;
    uVar1 = *(undefined4 *)&(src->m_path).from.z;
    uVar2 = *(undefined4 *)((long)&(src->m_path).from.z + 4);
    uVar3 = *(undefined4 *)&(src->m_path).to.x;
    uVar4 = *(undefined4 *)((long)&(src->m_path).to.x + 4);
    uVar5 = *(undefined4 *)((long)&(src->m_path).to.y + 4);
    uVar6 = *(undefined4 *)&(src->m_path).to.z;
    uVar7 = *(undefined4 *)((long)&(src->m_path).to.z + 4);
    *(undefined4 *)&(dst->m_path).to.y = *(undefined4 *)&(src->m_path).to.y;
    *(undefined4 *)((long)&(dst->m_path).to.y + 4) = uVar5;
    *(undefined4 *)&(dst->m_path).to.z = uVar6;
    *(undefined4 *)((long)&(dst->m_path).to.z + 4) = uVar7;
    *(undefined4 *)&(dst->m_path).from.z = uVar1;
    *(undefined4 *)((long)&(dst->m_path).from.z + 4) = uVar2;
    *(undefined4 *)&(dst->m_path).to.x = uVar3;
    *(undefined4 *)((long)&(dst->m_path).to.x + 4) = uVar4;
    (dst->m_path).from.x = dVar8;
    (dst->m_path).from.y = dVar9;
    dVar8 = (src->m_t).m_t[1];
    (dst->m_t).m_t[0] = (src->m_t).m_t[0];
    (dst->m_t).m_t[1] = dVar8;
    uVar1 = *(undefined4 *)((long)&(src->m_up).x + 4);
    uVar2 = *(undefined4 *)&(src->m_up).y;
    uVar3 = *(undefined4 *)((long)&(src->m_up).y + 4);
    *(undefined4 *)&(dst->m_up).x = *(undefined4 *)&(src->m_up).x;
    *(undefined4 *)((long)&(dst->m_up).x + 4) = uVar1;
    *(undefined4 *)&(dst->m_up).y = uVar2;
    *(undefined4 *)((long)&(dst->m_up).y + 4) = uVar3;
    (dst->m_up).z = (src->m_up).z;
    dst->m_profile_count = src->m_profile_count;
    if (src->m_profile == (ON_Curve *)0x0) {
      pOVar11 = (ON_Curve *)0x0;
    }
    else {
      iVar10 = (*(src->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      pOVar11 = (ON_Curve *)CONCAT44(extraout_var,iVar10);
    }
    dst->m_profile = pOVar11;
    dst->m_bCap[0] = src->m_bCap[0];
    dst->m_bCap[1] = src->m_bCap[1];
    dst->m_bHaveN[0] = src->m_bHaveN[0];
    dst->m_bHaveN[1] = src->m_bHaveN[1];
    dst->m_N[0].z = src->m_N[0].z;
    dVar8 = src->m_N[0].y;
    dst->m_N[0].x = src->m_N[0].x;
    dst->m_N[0].y = dVar8;
    dst->m_N[1].z = src->m_N[1].z;
    dVar8 = src->m_N[1].y;
    dst->m_N[1].x = src->m_N[1].x;
    dst->m_N[1].y = dVar8;
    dVar8 = (src->m_path_domain).m_t[1];
    (dst->m_path_domain).m_t[0] = (src->m_path_domain).m_t[0];
    (dst->m_path_domain).m_t[1] = dVar8;
    dst->m_bTransposed = src->m_bTransposed;
    ON_MeshCache::operator=(&dst->m_mesh_cache,&src->m_mesh_cache);
    return;
  }
  return;
}

Assistant:

static void ON_ExtrusionCopyHelper(const ON_Extrusion& src,ON_Extrusion& dst)
{
  if ( &src != &dst )
  {
    if ( dst.m_profile )
    {
      delete dst.m_profile;
      dst.m_profile = 0;
    }
    dst.m_path = src.m_path;
    dst.m_t = src.m_t;
    dst.m_up = src.m_up;
    dst.m_profile_count = src.m_profile_count;
    dst.m_profile = src.m_profile 
                  ? src.m_profile->DuplicateCurve() 
                  : 0;
    dst.m_bCap[0] = src.m_bCap[0];
    dst.m_bCap[1] = src.m_bCap[1];
    dst.m_bHaveN[0] = src.m_bHaveN[0];
    dst.m_bHaveN[1] = src.m_bHaveN[1];
    dst.m_N[0] = src.m_N[0];
    dst.m_N[1] = src.m_N[1];
    dst.m_path_domain = src.m_path_domain;
    dst.m_bTransposed  = src.m_bTransposed;
    dst.m_mesh_cache = src.m_mesh_cache;
  }
}